

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O1

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign2productShort<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *A,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **ppNVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  fpclass_type fVar5;
  int32_t iVar6;
  pointer pnVar7;
  Item *pIVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  pointer pnVar21;
  uint *puVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  cpp_dec_float<200U,_int,_void> *pcVar24;
  uint *puVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  byte bVar29;
  Real RVar30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  xi;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x0;
  fpclass_type local_3c8;
  cpp_dec_float<200U,_int,_void> local_398;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  uint local_2b8 [3];
  undefined3 uStack_2ab;
  int iStack_2a8;
  bool bStack_2a4;
  undefined8 local_2a0;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_298;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_290;
  long local_288;
  cpp_dec_float<200U,_int,_void> local_280;
  cpp_dec_float<200U,_int,_void> local_200;
  uint local_180 [28];
  uint local_110 [28];
  uint local_a0 [28];
  
  bVar29 = 0;
  uVar4 = (x->super_IdxSet).num;
  if ((ulong)uVar4 == 0) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)this);
    return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)this;
  }
  iVar12 = *(x->super_IdxSet).idx;
  local_290 = x;
  pnVar7 = (x->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar22 = (uint *)(pnVar7 + iVar12);
  pcVar23 = &local_200;
  for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
    (pcVar23->data)._M_elems[0] = *puVar22;
    puVar22 = puVar22 + 1;
    pcVar23 = (cpp_dec_float<200U,_int,_void> *)((pcVar23->data)._M_elems + 1);
  }
  iVar11 = pnVar7[iVar12].m_backend.exp;
  local_200.exp = iVar11;
  bVar2 = pnVar7[iVar12].m_backend.neg;
  local_200.neg = bVar2;
  fVar5 = pnVar7[iVar12].m_backend.fpclass;
  local_200.fpclass = fVar5;
  iVar6 = pnVar7[iVar12].m_backend.prec_elem;
  local_200.prec_elem = iVar6;
  pIVar8 = (A->set).theitem;
  local_298 = A;
  iVar12 = (A->set).thekey[iVar12].idx;
  *(int *)(this + 8) =
       pIVar8[iVar12].data.
       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .memused;
  pcVar23 = &local_200;
  puVar22 = local_a0;
  for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
    *puVar22 = (pcVar23->data)._M_elems[0];
    pcVar23 = (cpp_dec_float<200U,_int,_void> *)((pcVar23->data)._M_elems + 1);
    puVar22 = puVar22 + 1;
  }
  RVar30 = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
  puVar22 = local_a0;
  pcVar23 = &local_398;
  for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
    (pcVar23->data)._M_elems[0] = *puVar22;
    puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
    pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4);
  }
  local_398.exp = iVar11;
  local_398.neg = bVar2;
  local_398.prec_elem = iVar6;
  local_398.fpclass = fVar5;
  if ((bVar2 == true) && (local_398.data._M_elems[0] != 0 || fVar5 != cpp_dec_float_finite)) {
    local_398.neg = false;
  }
  bVar2 = false;
  if ((fVar5 != cpp_dec_float_NaN) && (bVar2 = false, !NAN(RVar30))) {
    local_2a0._0_4_ = cpp_dec_float_finite;
    local_2a0._4_4_ = 0x1c;
    local_318 = (undefined1  [16])0x0;
    local_308 = (undefined1  [16])0x0;
    local_2f8 = (undefined1  [16])0x0;
    local_2e8 = (undefined1  [16])0x0;
    local_2d8 = (undefined1  [16])0x0;
    local_2c8 = (undefined1  [16])0x0;
    local_2b8[0] = 0;
    local_2b8[1] = 0;
    stack0xfffffffffffffd50 = 0;
    uStack_2ab = 0;
    iStack_2a8 = 0;
    bStack_2a4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_318,RVar30);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_398,(cpp_dec_float<200U,_int,_void> *)local_318);
    bVar2 = iVar11 < 1;
  }
  if ((bVar2) || (*(int *)(this + 8) == 0)) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)this);
  }
  else if (0 < *(int *)(this + 8)) {
    lVar28 = 0;
    lVar16 = 0;
    uVar27 = 0;
    do {
      pNVar9 = pIVar8[iVar12].data.
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)&(pNVar9->val).m_backend.data + lVar28);
      local_398.fpclass = cpp_dec_float_finite;
      local_398.prec_elem = 0x1c;
      local_398.data._M_elems[0] = 0;
      local_398.data._M_elems[1] = 0;
      local_398.data._M_elems[2] = 0;
      local_398.data._M_elems[3] = 0;
      local_398.data._M_elems[4] = 0;
      local_398.data._M_elems[5] = 0;
      local_398.data._M_elems[6] = 0;
      local_398.data._M_elems[7] = 0;
      local_398.data._M_elems[8] = 0;
      local_398.data._M_elems[9] = 0;
      local_398.data._M_elems[10] = 0;
      local_398.data._M_elems[0xb] = 0;
      local_398.data._M_elems[0xc] = 0;
      local_398.data._M_elems[0xd] = 0;
      local_398.data._M_elems[0xe] = 0;
      local_398.data._M_elems[0xf] = 0;
      local_398.data._M_elems[0x10] = 0;
      local_398.data._M_elems[0x11] = 0;
      local_398.data._M_elems[0x12] = 0;
      local_398.data._M_elems[0x13] = 0;
      local_398.data._M_elems[0x14] = 0;
      local_398.data._M_elems[0x15] = 0;
      local_398.data._M_elems[0x16] = 0;
      local_398.data._M_elems[0x17] = 0;
      local_398.data._M_elems[0x18] = 0;
      local_398.data._M_elems[0x19] = 0;
      local_398.data._M_elems._104_5_ = 0;
      local_398.data._M_elems[0x1b]._1_3_ = 0;
      local_398.exp = 0;
      local_398.neg = false;
      pcVar20 = &local_200;
      if (pcVar23 != &local_398) {
        pcVar24 = &local_398;
        for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
          (pcVar24->data)._M_elems[0] = (pcVar20->data)._M_elems[0];
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar29 * -8 + 4);
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar29 * -8 + 4);
        }
        local_398.exp = local_200.exp;
        local_398.neg = local_200.neg;
        local_398.prec_elem = local_200.prec_elem;
        local_398.fpclass = local_200.fpclass;
        pcVar20 = pcVar23;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_398,pcVar20);
      *(undefined4 *)(*(long *)(this + 0x10) + (ulong)uVar27 * 4) =
           *(undefined4 *)((long)(&pNVar9->val + 1) + lVar28);
      lVar17 = *(long *)(this + 0x20);
      lVar14 = (long)*(int *)((long)(&pNVar9->val + 1) + lVar28) * 0x80;
      pcVar23 = &local_398;
      puVar22 = (uint *)(lVar17 + lVar14);
      for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
        *puVar22 = (pcVar23->data)._M_elems[0];
        pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4);
        puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
      }
      *(int *)(lVar17 + 0x70 + lVar14) = local_398.exp;
      *(bool *)(lVar17 + 0x74 + lVar14) = local_398.neg;
      *(undefined8 *)(lVar17 + 0x78 + lVar14) = local_398._120_8_;
      uVar15 = 1;
      if (local_398.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_318,0,(type *)0x0);
        iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_398,(cpp_dec_float<200U,_int,_void> *)local_318);
        uVar15 = (uint)(iVar11 != 0);
      }
      uVar27 = uVar27 + uVar15;
      lVar16 = lVar16 + 1;
      lVar28 = lVar28 + 0x84;
    } while (lVar16 < *(int *)(this + 8));
    goto LAB_00525fec;
  }
  uVar27 = 0;
LAB_00525fec:
  if (1 < (int)uVar4) {
    uVar19 = 1;
    do {
      iVar12 = (local_290->super_IdxSet).idx[uVar19];
      pnVar7 = (local_290->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar21 = pnVar7 + iVar12;
      pcVar23 = &local_280;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        (pcVar23->data)._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
        pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar29 * -2 + 1) * 4);
        pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + ((ulong)bVar29 * -2 + 1) * 4);
      }
      iVar11 = pnVar7[iVar12].m_backend.exp;
      local_280.exp = iVar11;
      bVar2 = pnVar7[iVar12].m_backend.neg;
      local_280.neg = bVar2;
      fVar5 = pnVar7[iVar12].m_backend.fpclass;
      local_280.fpclass = fVar5;
      iVar6 = pnVar7[iVar12].m_backend.prec_elem;
      local_280.prec_elem = iVar6;
      pIVar8 = (local_298->set).theitem;
      lVar16 = (long)(local_298->set).thekey[iVar12].idx;
      local_288 = lVar16 * 5;
      uVar15 = pIVar8[lVar16].data.
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused;
      pcVar23 = &local_280;
      puVar22 = local_180;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        *puVar22 = (pcVar23->data)._M_elems[0];
        pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + ((ulong)bVar29 * -2 + 1) * 4);
        puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
      }
      RVar30 = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
      puVar22 = local_180;
      pcVar23 = &local_398;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        (pcVar23->data)._M_elems[0] = *puVar22;
        puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
        pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4);
      }
      local_398.exp = iVar11;
      local_398.neg = bVar2;
      local_398.prec_elem = iVar6;
      local_398.fpclass = fVar5;
      if ((bVar2 == true) && (local_398.data._M_elems[0] != 0 || fVar5 != cpp_dec_float_finite)) {
        local_398.neg = false;
      }
      bVar2 = false;
      if ((fVar5 != cpp_dec_float_NaN) && (!NAN(RVar30))) {
        local_2a0._0_4_ = cpp_dec_float_finite;
        local_2a0._4_4_ = 0x1c;
        local_318 = (undefined1  [16])0x0;
        local_308 = (undefined1  [16])0x0;
        local_2f8 = (undefined1  [16])0x0;
        local_2e8 = (undefined1  [16])0x0;
        local_2d8 = (undefined1  [16])0x0;
        local_2c8 = (undefined1  [16])0x0;
        local_2b8[0] = 0;
        local_2b8[1] = 0;
        stack0xfffffffffffffd50 = 0;
        uStack_2ab = 0;
        iStack_2a8 = 0;
        bStack_2a4 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_318,RVar30);
        iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_398,(cpp_dec_float<200U,_int,_void> *)local_318);
        bVar2 = 0 < iVar12;
      }
      if ((bVar2) && (0 < (int)uVar15)) {
        ppNVar1 = &(pIVar8->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem + local_288;
        lVar16 = 0;
        do {
          pNVar9 = *ppNVar1;
          *(undefined4 *)(*(long *)(this + 0x10) + (long)(int)uVar27 * 4) =
               *(undefined4 *)((long)(&pNVar9->val + 1) + lVar16);
          lVar28 = *(long *)(this + 0x20);
          lVar17 = (long)*(int *)((long)(&pNVar9->val + 1) + lVar16) * 0x80;
          puVar22 = (uint *)(lVar28 + lVar17);
          pcVar23 = &local_398;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar23->data)._M_elems[0] = *puVar22;
            puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4);
          }
          local_398.exp = *(int *)(lVar28 + 0x70 + lVar17);
          local_398.neg = (bool)*(char *)(lVar28 + 0x74 + lVar17);
          uVar10 = *(undefined8 *)(lVar28 + 0x78 + lVar17);
          local_398.fpclass = (fpclass_type)uVar10;
          local_398.prec_elem = SUB84(uVar10,4);
          uVar26 = 0;
          if ((fpclass_type)uVar10 != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_318,0,(type *)0x0);
            iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_398,(cpp_dec_float<200U,_int,_void> *)local_318);
            uVar26 = (uint)(iVar12 == 0);
          }
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)&(pNVar9->val).m_backend.data + lVar16)
          ;
          local_2a0._0_4_ = cpp_dec_float_finite;
          local_2a0._4_4_ = 0x1c;
          local_318 = ZEXT816(0);
          local_308 = ZEXT816(0);
          local_2f8 = ZEXT816(0);
          local_2e8 = ZEXT816(0);
          local_2d8 = ZEXT816(0);
          local_2c8 = ZEXT816(0);
          local_2b8[0] = 0;
          local_2b8[1] = 0;
          stack0xfffffffffffffd50 = 0;
          uStack_2ab = 0;
          iStack_2a8 = 0;
          bStack_2a4 = false;
          pcVar23 = &local_280;
          if (pcVar20 != (cpp_dec_float<200U,_int,_void> *)local_318) {
            pcVar24 = (cpp_dec_float<200U,_int,_void> *)local_318;
            for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
              (pcVar24->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4);
              pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar29 * -8 + 4);
            }
            iStack_2a8 = local_280.exp;
            bStack_2a4 = local_280.neg;
            local_2a0._4_4_ = local_280.prec_elem;
            local_2a0._0_4_ = local_280.fpclass;
            pcVar23 = pcVar20;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_318,pcVar23);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&local_398,(cpp_dec_float<200U,_int,_void> *)local_318);
          if (local_398.fpclass == cpp_dec_float_NaN) {
LAB_00526363:
            lVar28 = *(long *)(this + 0x20);
            lVar17 = (long)(int)pcVar20[1].data._M_elems[0] * 0x80;
            pcVar23 = &local_398;
            puVar22 = (uint *)(lVar28 + lVar17);
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              *puVar22 = (pcVar23->data)._M_elems[0];
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4);
              puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
            }
            *(int *)(lVar28 + 0x70 + lVar17) = local_398.exp;
            *(bool *)(lVar28 + 0x74 + lVar17) = local_398.neg;
            *(undefined8 *)(lVar28 + 0x78 + lVar17) = local_398._120_8_;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_318,0,(type *)0x0);
            iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_398,(cpp_dec_float<200U,_int,_void> *)local_318);
            if (iVar12 != 0) goto LAB_00526363;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)
                       ((long)(int)pcVar20[1].data._M_elems[0] * 0x80 + *(long *)(this + 0x20)),
                       1e-100);
          }
          uVar27 = uVar27 + uVar26;
          lVar16 = lVar16 + 0x84;
        } while ((ulong)uVar15 * 0x84 != lVar16);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar4);
  }
  if (0 < (int)uVar27) {
    uVar19 = 0;
    iVar12 = 0;
    do {
      lVar16 = *(long *)(this + 0x20);
      iVar11 = *(int *)(*(long *)(this + 0x10) + uVar19 * 4);
      lVar17 = (long)iVar11 * 0x80;
      puVar22 = (uint *)(lVar16 + lVar17);
      puVar25 = local_110;
      for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
        *puVar25 = *puVar22;
        puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
        puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
      }
      iVar13 = *(int *)(lVar16 + 0x70 + lVar17);
      cVar3 = *(char *)(lVar16 + 0x74 + lVar17);
      uVar10 = *(undefined8 *)(lVar16 + 0x78 + lVar17);
      RVar30 = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
      puVar22 = local_110;
      pcVar23 = &local_398;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        (pcVar23->data)._M_elems[0] = *puVar22;
        puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
        pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4);
      }
      local_3c8 = (fpclass_type)uVar10;
      local_398.neg = (bool)cVar3;
      if ((cVar3 == '\x01') &&
         (local_398.data._M_elems[0] != 0 || local_3c8 != cpp_dec_float_finite)) {
        local_398.neg = false;
      }
      local_398.exp = iVar13;
      local_398._120_8_ = uVar10;
      if ((local_3c8 == cpp_dec_float_NaN) || (NAN(RVar30))) {
LAB_00526587:
        *(int *)(*(long *)(this + 0x10) + (long)iVar12 * 4) = iVar11;
        iVar12 = iVar12 + 1;
      }
      else {
        local_2a0._0_4_ = cpp_dec_float_finite;
        local_2a0._4_4_ = 0x1c;
        local_318 = (undefined1  [16])0x0;
        local_308 = (undefined1  [16])0x0;
        local_2f8 = (undefined1  [16])0x0;
        local_2e8 = (undefined1  [16])0x0;
        local_2d8 = (undefined1  [16])0x0;
        local_2c8 = (undefined1  [16])0x0;
        local_2b8[0] = 0;
        local_2b8[1] = 0;
        stack0xfffffffffffffd50 = 0;
        uStack_2ab = 0;
        iStack_2a8 = 0;
        bStack_2a4 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_318,RVar30);
        iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_398,(cpp_dec_float<200U,_int,_void> *)local_318);
        if (0 < iVar13) goto LAB_00526587;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)(lVar17 + *(long *)(this + 0x20)),0);
      }
      *(int *)(this + 8) = iVar12;
      uVar19 = uVar19 + 1;
    } while (uVar27 != uVar19);
  }
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2productShort(const SVSetBase<S>& A,
      const SSVectorBase<T>& x)
{
   assert(x.isSetup());

   if(x.size() == 0)   // x can be setup but have size 0 => this := zero vector
   {
      clear();
      return *this;
   }

   // compute x[0] * A[0]
   int curidx = x.idx[0];
   const T x0 = x.val[curidx];
   const SVectorBase<S>& A0 = A[curidx];
   int nonzero_idx = 0;
   int xsize = x.size();
   int Aisize;

   num = A0.size();

   if(isZero(x0, this->tolerances()->epsilon()) || num == 0)
   {
      // A[0] == 0 or x[0] == 0 => this := zero vector
      clear();
   }
   else
   {
      for(int j = 0; j < num; ++j)
      {
         const Nonzero<S>& elt = A0.element(j);
         const R product = x0 * elt.val;

         // store the value in any case
         idx[nonzero_idx] = elt.idx;
         VectorBase<R>::val[elt.idx] = product;

         // count only non-zero values; not 'isNotZero(product, epsilon)'
         if(product != 0)
            ++nonzero_idx;
      }
   }

   // Compute the other x[i] * A[i] and add them to the existing vector.
   for(int i = 1; i < xsize; ++i)
   {
      curidx = x.idx[i];
      const T xi     = x.val[curidx];
      const SVectorBase<S>& Ai = A[curidx];

      // If A[i] == 0 or x[i] == 0, do nothing.
      Aisize = Ai.size();

      if(isNotZero(xi, this->tolerances()->epsilon()) || Aisize == 0)
      {
         // Compute x[i] * A[i] and add it to the existing vector.
         for(int j = 0; j < Aisize; ++j)
         {
            const Nonzero<S>& elt = Ai.element(j);
            idx[nonzero_idx] = elt.idx;
            R oldval  = VectorBase<R>::val[elt.idx];

            // An old value of exactly 0 means the position is still unused.
            // It will be used now (either by a new nonzero or by a SOPLEX_VECTOR_MARKER),
            // so increase the counter. If oldval != 0, we just
            // change an existing NZ-element, so don't increase the counter.
            if(oldval == 0)
               ++nonzero_idx;

            // Add the current product x[i] * A[i][j]; if oldval was
            // SOPLEX_VECTOR_MARKER before, it does not hurt because SOPLEX_VECTOR_MARKER is really small.
            oldval += xi * elt.val;

            // If the new value is exactly 0, mark the index as used
            // by setting a value which is nearly 0; otherwise, store
            // the value. Values below epsilon will be removed later.
            if(oldval == 0)
               VectorBase<R>::val[elt.idx] = SOPLEX_VECTOR_MARKER;
            else
               VectorBase<R>::val[elt.idx] = oldval;
         }
      }
   }

   // Clean up by shifting all nonzeros (w.r.t. epsilon) to the front of idx,
   // zeroing all values which are nearly 0, and setting #num# appropriately.
   int nz_counter = 0;

   for(int i = 0; i < nonzero_idx; ++i)
   {
      curidx = idx[i];

      if(isZero(VectorBase<R>::val[curidx], this->tolerances()->epsilon()))
         VectorBase<R>::val[curidx] = 0;
      else
      {
         idx[nz_counter] = curidx;
         ++nz_counter;
      }

      num = nz_counter;
   }

   assert(isConsistent());

   return *this;
}